

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_analyze.cpp
# Opt level: O2

string * type2str_abi_cxx11_(string *__return_storage_ptr__,TokenType *type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  switch(*type) {
  case ID_TYPE:
    pcVar2 = "Identifier";
    paVar1 = &local_1d;
    break;
  case INT_LITERAL_TYPE:
    pcVar2 = "IntLiteral";
    paVar1 = &local_1c;
    break;
  case KEY_TYPE:
    pcVar2 = "Key";
    paVar1 = &local_18;
    break;
  case ASSIGN_TYPE:
    pcVar2 = "ASSIGN";
    paVar1 = &local_1b;
    break;
  case GLT_TYPE:
    pcVar2 = "GLT";
    paVar1 = &local_1a;
    break;
  case GLE_TYPE:
    pcVar2 = "GLE";
    paVar1 = &local_19;
    break;
  case PLUS_TYPE:
    pcVar2 = "Plus";
    paVar1 = &local_17;
    break;
  case MINUS_TYPE:
    pcVar2 = "Minus";
    paVar1 = &local_16;
    break;
  case STAR_TYPE:
    pcVar2 = "Star";
    paVar1 = &local_15;
    break;
  case SLASH_TYPE:
    pcVar2 = "Slash";
    paVar1 = &local_14;
    break;
  default:
    pcVar2 = "None";
    paVar1 = &local_11;
    break;
  case LBRACKET_TYPE:
    pcVar2 = "LBracket";
    paVar1 = &local_13;
    break;
  case RBRACKET_TYPE:
    pcVar2 = "RBracket";
    paVar1 = &local_12;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string type2str(const TokenType& type) {
    switch (type) {
        case ID_TYPE:
            return "Identifier";
        case INT_LITERAL_TYPE:
            return "IntLiteral";
        case ASSIGN_TYPE:
            return "ASSIGN";
        case GLT_TYPE:
            return "GLT";
        case GLE_TYPE:
            return "GLE";
        case KEY_TYPE:
            return "Key";
        case PLUS_TYPE:
            return "Plus";
        case MINUS_TYPE:
            return "Minus";
        case STAR_TYPE:
            return "Star";
        case SLASH_TYPE:
            return "Slash";
        case LBRACKET_TYPE:
            return "LBracket";
        case RBRACKET_TYPE:
            return "RBracket";
        default:
            return "None";
    }
}